

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathDivValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr pxVar1;
  double dVar2;
  int iStack_20;
  
  pxVar1 = xmlXPathValuePop(ctxt);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    iStack_20 = 10;
  }
  else {
    dVar2 = xmlXPathCastToNumberInternal(ctxt,pxVar1);
    xmlXPathReleaseObject(ctxt->context,pxVar1);
    pxVar1 = ctxt->value;
    if (pxVar1 != (xmlXPathObjectPtr)0x0) {
      if (pxVar1->type == XPATH_NUMBER) {
LAB_001b267a:
        pxVar1->floatval = pxVar1->floatval / dVar2;
        return;
      }
      xmlXPathNumberFunction(ctxt,1);
      pxVar1 = ctxt->value;
      if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) goto LAB_001b267a;
    }
    iStack_20 = 0xb;
  }
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathDivValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double val;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    val = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval /= val;
}